

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewScopeLayer.cpp
# Opt level: O3

void __thiscall
NewScopeLayer::NewScopeLayer
          (NewScopeLayer *this,NewScopeLayer *parent,string *name,Symbol *class_symbol,
          Symbol *method_symbol)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  NewScopeLayer *local_38;
  
  paVar1 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name_).field_2 + 8) = uVar4;
  }
  else {
    (this->name_)._M_dataplus._M_p = pcVar3;
    (this->name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name_)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  this->parent_ = parent;
  (this->children_).super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children_).super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children_).super__Vector_base<NewScopeLayer_*,_std::allocator<NewScopeLayer_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->class_symbol_).name_._M_dataplus._M_p = (pointer)&(this->class_symbol_).name_.field_2;
  pcVar3 = (class_symbol->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->class_symbol_,pcVar3,pcVar3 + (class_symbol->name_)._M_string_length);
  (this->method_symbol_).name_._M_dataplus._M_p = (pointer)&(this->method_symbol_).name_.field_2;
  pcVar3 = (method_symbol->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->method_symbol_,pcVar3,pcVar3 + (method_symbol->name_)._M_string_length
            );
  this->traverse_index = 0;
  (this->variables_)._M_h._M_buckets = &(this->variables_)._M_h._M_single_bucket;
  (this->variables_)._M_h._M_bucket_count = 1;
  (this->variables_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->variables_)._M_h._M_element_count = 0;
  (this->variables_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->variables_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->variables_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->arrays_)._M_h._M_buckets = &(this->arrays_)._M_h._M_single_bucket;
  (this->arrays_)._M_h._M_bucket_count = 1;
  (this->arrays_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->arrays_)._M_h._M_element_count = 0;
  (this->arrays_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->arrays_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->arrays_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->user_type_system_)._M_h._M_buckets = &(this->user_type_system_)._M_h._M_single_bucket;
  (this->user_type_system_)._M_h._M_bucket_count = 1;
  (this->user_type_system_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->user_type_system_)._M_h._M_element_count = 0;
  (this->user_type_system_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->user_type_system_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->user_type_system_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->symbol_types_)._M_h._M_buckets = &(this->symbol_types_)._M_h._M_single_bucket;
  (this->symbol_types_)._M_h._M_bucket_count = 1;
  (this->symbol_types_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->symbol_types_)._M_h._M_element_count = 0;
  (this->symbol_types_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->symbol_types_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->symbol_types_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_38 = this;
  std::vector<NewScopeLayer*,std::allocator<NewScopeLayer*>>::emplace_back<NewScopeLayer*&>
            ((vector<NewScopeLayer*,std::allocator<NewScopeLayer*>> *)&this->parent_->children_,
             &local_38);
  return;
}

Assistant:

NewScopeLayer::NewScopeLayer(NewScopeLayer* parent, std::string name,
                             const Symbol& class_symbol,
                             const Symbol& method_symbol)
    : parent_(parent),
      name_(std::move(name)),
      class_symbol_(class_symbol),
      method_symbol_(method_symbol),
      traverse_index(0) {
  parent_->AddChild(this);
}